

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

double r8_factorial(int n)

{
  double dVar1;
  double dVar2;
  
  if (n < 1) {
    dVar1 = 1.0;
  }
  else {
    dVar1 = 1.0;
    dVar2 = 1.0;
    do {
      dVar1 = dVar1 * dVar2;
      dVar2 = dVar2 + 1.0;
      n = n + -1;
    } while (n != 0);
  }
  return dVar1;
}

Assistant:

double r8_factorial ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    R8_FACTORIAL computes the factorial of N.
//
//  Discussion:
//
//    factorial ( N ) = product ( 1 <= I <= N ) I
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 January 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the argument of the factorial function.
//    If N is less than 1, the function value is returned as 1.
//
//    Output, double R8_FACTORIAL, the factorial of N.
//
{
  int i;
  double value;

  value = 1.0;

  for ( i = 1; i <= n; i++ )
  {
    value = value * double( i );
  }

  return value;
}